

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

TrackData *
GeneratePrehistorikTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  Data *data;
  BitBuffer *bitstream;
  int gap3_bytes;
  pointer this;
  BitstreamTrackBuilder bitbuf;
  BitstreamTrackBuilder local_b0;
  
  bVar2 = IsPrehistorikTrack(track);
  if (!bVar2) {
    __assert_fail("IsPrehistorikTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x2e6,"TrackData GeneratePrehistorikTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder(&local_b0,_250K,MFM);
  TrackBuilder::addTrackStart(&local_b0.super_TrackBuilder,false);
  iVar3 = Track::size(track);
  gap3_bytes = 0x1e;
  if (iVar3 == 0xb) {
    gap3_bytes = 0x6a;
  }
  this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
         super__Vector_impl_data._M_start;
  pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pSVar1) {
    do {
      if ((this->header).sector == 0xc) {
        data = Sector::data_copy(this,0);
        TrackBuilder::addSector
                  (&local_b0.super_TrackBuilder,&this->header,data,gap3_bytes,this->dam,true);
        break;
      }
      TrackBuilder::addSector(&local_b0.super_TrackBuilder,this,gap3_bytes);
      this = this + 1;
    } while (this != pSVar1);
  }
  bitstream = BitstreamTrackBuilder::buffer(&local_b0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  if (local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_buffer.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TrackData GeneratePrehistorikTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsPrehistorikTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto gap3 = (track.size() == 11) ? 106 : 30;
    for (auto& sector : track)
    {
        if (sector.header.sector != 12)
            bitbuf.addSector(sector, gap3);
        else
        {
            bitbuf.addSector(sector.header, sector.data_copy(), gap3, sector.dam, true);
            break;
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}